

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O0

void __thiscall embree::TutorialApplication::run(TutorialApplication *this,int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  long in_RDI;
  FileName *in_stack_00000028;
  TutorialApplication *in_stack_00000030;
  FileName *in_stack_000000e8;
  TutorialApplication *in_stack_000000f0;
  char *in_stack_000001f8;
  FileName *in_stack_ffffffffffffff68;
  FileName *this_00;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  FileName local_68;
  string local_38 [56];
  
  rtcSetDeviceProperty(0,1000000,(long)*(int *)(in_RDI + 0x2f4));
  rtcSetDeviceProperty(0,0xf4241,(long)*(int *)(in_RDI + 0x2f8));
  rtcSetDeviceProperty(0,0xf4242,(long)*(int *)(in_RDI + 0x2fc));
  rtcSetDeviceProperty(0,0xf4243,(long)*(int *)(in_RDI + 0x300));
  std::__cxx11::string::c_str();
  device_init(in_stack_000001f8);
  embree::FileName::str_abi_cxx11_(in_stack_ffffffffffffff68);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                          (char *)in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_38);
  if (bVar1) {
    renderToFile(in_stack_00000030,in_stack_00000028);
  }
  this_00 = &local_68;
  embree::FileName::str_abi_cxx11_(this_00);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                          (char *)this_00);
  std::__cxx11::string::~string((string *)&local_68);
  if ((bVar2 & 1) != 0) {
    compareToReferenceImage(in_stack_000000f0,in_stack_000000e8);
  }
  if ((*(byte *)(in_RDI + 0x178) & 1) != 0) {
    renderInteractive((TutorialApplication *)CONCAT17(bVar2,in_stack_ffffffffffffff70));
  }
  return;
}

Assistant:

void TutorialApplication::run(int argc, char** argv)
  {
    /* set debug values */
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000000, debug0);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000001, debug1);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000002, debug2);
    rtcSetDeviceProperty(nullptr,(RTCDeviceProperty) 1000003, debug3);

    /* initialize ray tracing core */
    device_init(rtcore.c_str());

    /* render to disk */
    if (outputImageFilename.str() != "")
      renderToFile(outputImageFilename);

    /* compare to reference image */
    if (referenceImageFilename.str() != "")
      compareToReferenceImage(referenceImageFilename);

#if defined(USE_GLFW)
    
    /* interactive mode */
    if (interactive)
      renderInteractive();
    
#else
    if (interactive) 
      std::cout << "GLFW is disabled, you can only render to disk using -o command line option." << std::endl;
#endif
  }